

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall JAMA::Eigenvalue<double>::tql2(Eigenvalue<double> *this)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  uint j_00;
  uint uVar4;
  reference pvVar5;
  double *pdVar6;
  int iVar7;
  int *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa_02;
  int j_1;
  int j;
  double p_1;
  int k_1;
  int i_3;
  int k;
  int i_2;
  double s2;
  double s;
  double el1;
  double c3;
  double c2;
  double c;
  int i_1;
  double h;
  double dl1;
  double r;
  double p;
  double g;
  int iter;
  int m;
  int l;
  double eps;
  double tst1;
  double f;
  int i;
  size_type in_stack_fffffffffffffe48;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  uint local_c0;
  uint local_bc;
  double local_b8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_78;
  int local_6c;
  double local_58;
  double local_50;
  uint local_3c;
  double local_38;
  uint local_2c;
  double local_28;
  double local_20;
  double local_18;
  int local_c;
  
  for (local_c = 1; local_c < *in_RDI; local_c = local_c + 1) {
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    vVar1 = *pvVar5;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    *pvVar5 = vVar1;
  }
  pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                     (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  *pvVar5 = 0.0;
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = pow(2.0,-52.0);
  local_2c = 0;
  do {
    if (*in_RDI <= (int)local_2c) {
      for (local_ac = 0; (int)local_ac < *in_RDI + -1; local_ac = local_ac + 1) {
        local_b0 = local_ac;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        local_b8 = *pvVar5;
        local_bc = local_ac;
        while (local_bc = local_bc + 1, (int)local_bc < *in_RDI) {
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          if (*pvVar5 < local_b8) {
            local_b0 = local_bc;
            pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                               (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            local_b8 = *pvVar5;
          }
        }
        if (local_b0 != local_ac) {
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          vVar1 = *pvVar5;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *pvVar5 = vVar1;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *pvVar5 = local_b8;
          for (local_c0 = 0; (int)local_c0 < *in_RDI; local_c0 = local_c0 + 1) {
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c0,local_ac);
            dVar9 = *pdVar6;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c0,local_b0);
            in_stack_fffffffffffffe50 = (DynamicVector<double,_std::allocator<double>_> *)*pdVar6;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c0,local_ac);
            *pdVar6 = (double)in_stack_fffffffffffffe50;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c0,local_b0);
            *pdVar6 = dVar9;
          }
        }
      }
      return;
    }
    iVar3 = (int)in_RDI;
    iVar7 = iVar3 + 8;
    OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::abs(iVar7);
    iVar7 = iVar3 + 0x20;
    OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::abs(iVar7);
    local_38 = extraout_XMM0_Qa + extraout_XMM0_Qa_00;
    pdVar6 = std::max<double>(&local_20,&local_38);
    local_20 = *pdVar6;
    for (local_3c = local_2c; (int)local_3c < *in_RDI; local_3c = local_3c + 1) {
      iVar7 = iVar3 + 0x20;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::abs(iVar7);
      if (extraout_XMM0_Qa_01 <= local_28 * local_20) break;
    }
    if ((int)local_2c < (int)local_3c) {
      do {
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar9 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar8 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar8 = (dVar8 - dVar9) / (*pvVar5 * 2.0);
        local_58 = hypot(dVar8,1.0);
        if (dVar8 < 0.0) {
          local_58 = -local_58;
        }
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar2 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        *pvVar5 = dVar2 / (dVar8 + local_58);
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar2 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        *pvVar5 = dVar2 * (dVar8 + local_58);
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar8 = *pvVar5;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar9 = dVar9 - *pvVar5;
        for (local_6c = local_2c + 2; local_6c < *in_RDI; local_6c = local_6c + 1) {
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *pvVar5 = *pvVar5 - dVar9;
        }
        local_18 = local_18 + dVar9;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        local_50 = *pvVar5;
        local_78 = 1.0;
        local_80 = 1.0;
        local_88 = 1.0;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar9 = *pvVar5;
        local_98 = 0.0;
        local_a0 = 0.0;
        uVar4 = local_3c;
        while (j_00 = uVar4, local_a4 = j_00 - 1, (int)local_2c <= (int)local_a4) {
          local_88 = local_80;
          local_80 = local_78;
          local_a0 = local_98;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          dVar10 = local_78 * *pvVar5;
          dVar11 = local_78 * local_50;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          local_78 = hypot(local_50,*pvVar5);
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *pvVar5 = local_98 * local_78;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          local_98 = *pvVar5 / local_78;
          local_78 = local_50 / local_78;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          local_50 = local_78 * *pvVar5 + -(local_98 * dVar10);
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          dVar2 = *pvVar5;
          pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *pvVar5 = local_98 * (local_78 * dVar10 + local_98 * dVar2) + dVar11;
          for (local_a8 = 0; uVar4 = local_a4, (int)local_a8 < *in_RDI; local_a8 = local_a8 + 1) {
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_a8,j_00);
            dVar2 = *pdVar6;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_a8,local_a4);
            dVar10 = *pdVar6;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_a8,j_00);
            *pdVar6 = local_98 * dVar10 + local_78 * dVar2;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_a8,local_a4);
            dVar10 = *pdVar6;
            pdVar6 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_a8,local_a4);
            *pdVar6 = local_78 * dVar10 + -(local_98 * dVar2);
          }
        }
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        dVar8 = (-local_98 * local_a0 * local_88 * dVar9 * *pvVar5) / dVar8;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        *pvVar5 = local_98 * dVar8;
        pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        *pvVar5 = local_78 * dVar8;
        iVar7 = iVar3 + 0x20;
        OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        std::abs(iVar7);
      } while (local_28 * local_20 < extraout_XMM0_Qa_02);
    }
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    dVar9 = *pvVar5 + local_18;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    *pvVar5 = dVar9;
    pvVar5 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    *pvVar5 = 0.0;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void tql2() {
      //  This is derived from the Algol procedures tql2, by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int i = 1; i < n; i++) {
        e(i - 1) = e(i);
      }
      e(n - 1) = 0.0;

      Real f    = 0.0;
      Real tst1 = 0.0;
      Real eps  = pow(2.0, -52.0);
      for (int l = 0; l < n; l++) {
        // Find small subdiagonal element

        tst1  = max(tst1, abs(d(l)) + abs(e(l)));
        int m = l;

        // Original while-loop from Java code
        while (m < n) {
          if (abs(e(m)) <= eps * tst1) { break; }
          m++;
        }

        // If m == l, d(l) is an eigenvalue,
        // otherwise, iterate.

        if (m > l) {
          int iter = 0;
          do {
            iter = iter + 1;  // (Could check iteration count here.)

            // Compute implicit shift

            Real g = d(l);
            Real p = (d(l + 1) - g) / (2.0 * e(l));
            Real r = hypot(p, 1.0);
            if (p < 0) { r = -r; }
            d(l)     = e(l) / (p + r);
            d(l + 1) = e(l) * (p + r);
            Real dl1 = d(l + 1);
            Real h   = g - d(l);
            for (int i = l + 2; i < n; i++) {
              d(i) -= h;
            }
            f = f + h;

            // Implicit QL transformation.

            p        = d(m);
            Real c   = 1.0;
            Real c2  = c;
            Real c3  = c;
            Real el1 = e(l + 1);
            Real s   = 0.0;
            Real s2  = 0.0;
            for (int i = m - 1; i >= l; i--) {
              c3       = c2;
              c2       = c;
              s2       = s;
              g        = c * e(i);
              h        = c * p;
              r        = hypot(p, e(i));
              e(i + 1) = s * r;
              s        = e(i) / r;
              c        = p / r;
              p        = c * d(i) - s * g;
              d(i + 1) = h + s * (c * g + s * d(i));

              // Accumulate transformation.

              for (int k = 0; k < n; k++) {
                h           = V(k, i + 1);
                V(k, i + 1) = s * V(k, i) + c * h;
                V(k, i)     = c * V(k, i) - s * h;
              }
            }
            p    = -s * s2 * c3 * el1 * e(l) / dl1;
            e(l) = s * p;
            d(l) = c * p;

            // Check for convergence.

          } while (abs(e(l)) > eps * tst1);
        }
        d(l) = d(l) + f;
        e(l) = 0.0;
      }

      // Sort eigenvalues and corresponding vectors.

      for (int i = 0; i < n - 1; i++) {
        int k  = i;
        Real p = d(i);
        for (int j = i + 1; j < n; j++) {
          if (d(j) < p) {
            k = j;
            p = d(j);
          }
        }
        if (k != i) {
          d(k) = d(i);
          d(i) = p;
          for (int j = 0; j < n; j++) {
            p       = V(j, i);
            V(j, i) = V(j, k);
            V(j, k) = p;
          }
        }
      }
    }